

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ogg.c
# Opt level: O2

void ogg_page_init(ogg_page_t *page)

{
  uint __line;
  char *__assertion;
  
  if (page == (ogg_page_t *)0x0) {
    __assertion = "page != NULL";
    __line = 0x16;
  }
  else {
    (page->raw).size = 0;
    (page->raw).data = (uchar *)0x0;
    page->stream = 0;
    page->page_no = 0;
    *(undefined8 *)((long)&page->page_no + 1) = 0;
    *(undefined8 *)((long)&page->page_cksum + 1) = 0;
    buf_alloc(&page->raw,4000);
    if ((page->raw).data != (uchar *)0x0) {
      page->size = 0;
      return;
    }
    __assertion = "page->raw.data != NULL";
    __line = 0x20;
  }
  __assert_fail(__assertion,"/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/ogg.c",
                __line,"void ogg_page_init(ogg_page_t *)");
}

Assistant:

void ogg_page_init(ogg_page_t *page) {
  assert(page != NULL);
  
  page->raw.size = 0;
  page->raw.data = NULL;
  page->page_segments = 0;
  page->page_no = 0;
  page->stream = 0;
  page->page_cksum = 0;
  
  buf_alloc(&page->raw, 4000);
  assert(page->raw.data != NULL);
  
  page->size = 0;
}